

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall capnp::SchemaLoader::~SchemaLoader(SchemaLoader *this)

{
  kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>::dispose(&(this->impl).value);
  kj::_::Mutex::~Mutex((Mutex *)this);
  return;
}

Assistant:

SchemaLoader::~SchemaLoader() noexcept(false) {}